

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display-curses.c
# Opt level: O1

void DrawCmdLabel(ECommand_t cmd,int x,int y)

{
  __int32_t *p_Var1;
  char cVar2;
  int iVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  int iVar6;
  
  pp_Var4 = __ctype_toupper_loc();
  p_Var1 = *pp_Var4;
  cVar2 = ctrl_GetCmdKey(cmd);
  iVar6 = (int)(char)p_Var1[cVar2];
  if (iVar6 == 9) {
    pcVar5 = "[tab]";
  }
  else if (iVar6 == 10) {
    pcVar5 = "[enter]";
  }
  else {
    if (iVar6 != 0x20) {
      iVar3 = wmove(_stdscr,y,x);
      if (iVar3 != -1) {
        waddch(_stdscr,iVar6);
        return;
      }
      return;
    }
    pcVar5 = "[space]";
  }
  mvwprintw(_stdscr,y,x,pcVar5);
  return;
}

Assistant:

static void DrawCmdLabel(ECommand_t cmd, int x, int y)
{
  char c = toupper(ctrl_GetCmdKey(cmd));
  switch (c) {
    case ' ': mvwprintw(stdscr, y, x, "[space]"); break;
    case '\n': mvwprintw(stdscr, y, x, "[enter]"); break;
    case '\t': mvwprintw(stdscr, y, x, "[tab]"); break;
    default: mvwaddch(stdscr, y, x, c); break;
  }
}